

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O0

double flexbuffers::ReadSizedScalar<double,signed_char,short,float,double>
                 (uint8_t *data,uint8_t byte_width)

{
  char cVar1;
  short sVar2;
  int iVar3;
  float fVar4;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  uint8_t byte_width_local;
  uint8_t *data_local;
  
  if (byte_width < 4) {
    if (byte_width < 2) {
      cVar1 = flatbuffers::ReadScalar<signed_char>(data);
      iVar3 = (int)cVar1;
    }
    else {
      sVar2 = flatbuffers::ReadScalar<short>(data);
      iVar3 = (int)sVar2;
    }
    local_20 = (double)iVar3;
    local_28 = local_20;
  }
  else {
    if (byte_width < 8) {
      fVar4 = flatbuffers::ReadScalar<float>(data);
      local_30 = (double)fVar4;
    }
    else {
      local_30 = flatbuffers::ReadScalar<double>(data);
    }
    local_28 = local_30;
  }
  return local_28;
}

Assistant:

R ReadSizedScalar(const uint8_t *data, uint8_t byte_width) {
  return byte_width < 4
             ? (byte_width < 2
                    ? static_cast<R>(flatbuffers::ReadScalar<T1>(data))
                    : static_cast<R>(flatbuffers::ReadScalar<T2>(data)))
             : (byte_width < 8
                    ? static_cast<R>(flatbuffers::ReadScalar<T4>(data))
                    : static_cast<R>(flatbuffers::ReadScalar<T8>(data)));
}